

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O2

void __thiscall cfd::core::Psbt::Combine(Psbt *this,Psbt *transaction)

{
  CfdException *pCVar1;
  allocator local_7d;
  int ret;
  wally_psbt *src_pointer;
  Transaction local_70;
  vector<unsigned_char,_std::allocator<unsigned_char>_> bytes;
  
  GetData((ByteData *)&local_70,transaction);
  ByteData::GetBytes(&bytes,(ByteData *)&local_70);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_70);
  src_pointer = (wally_psbt *)0x0;
  ret = wally_psbt_from_bytes
                  (bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   (long)bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                   (long)bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start,&src_pointer);
  if (ret != 0) {
    local_70.super_AbstractTransaction._vptr_AbstractTransaction = (_func_int **)0x4b240b;
    local_70.super_AbstractTransaction.wally_tx_pointer_._0_4_ = 0x848;
    local_70.vin_.super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x4b2ffe;
    logger::warn<int&>((CfdSourceLocation *)&local_70,"wally_psbt_from_bytes NG[{}]",&ret);
    pCVar1 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string((string *)&local_70,"psbt from bytes error.",&local_7d);
    CfdException::CfdException(pCVar1,kCfdInternalError,(string *)&local_70);
    __cxa_throw(pCVar1,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ret = wally_psbt_combine((wally_psbt *)this->wally_psbt_pointer_,src_pointer);
  wally_psbt_free(src_pointer);
  if (ret == 0) {
    RebuildTransaction(&local_70,this->wally_psbt_pointer_);
    Transaction::operator=(&this->base_tx_,&local_70);
    Transaction::~Transaction(&local_70);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    return;
  }
  local_70.super_AbstractTransaction._vptr_AbstractTransaction = (_func_int **)0x4b240b;
  local_70.super_AbstractTransaction.wally_tx_pointer_._0_4_ = 0x851;
  local_70.vin_.super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x4b2ffe;
  logger::warn<int&>((CfdSourceLocation *)&local_70,"wally_psbt_combine NG[{}]",&ret);
  pCVar1 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string((string *)&local_70,"psbt combine error.",&local_7d);
  CfdException::CfdException(pCVar1,kCfdIllegalArgumentError,(string *)&local_70);
  __cxa_throw(pCVar1,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

void Psbt::Combine(const Psbt &transaction) {
  std::vector<uint8_t> bytes = transaction.GetData().GetBytes();
  struct wally_psbt *src_pointer = nullptr;
  int ret = wally_psbt_from_bytes(bytes.data(), bytes.size(), &src_pointer);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_psbt_from_bytes NG[{}]", ret);
    throw CfdException(kCfdInternalError, "psbt from bytes error.");
  }

  struct wally_psbt *psbt_pointer;
  psbt_pointer = static_cast<struct wally_psbt *>(wally_psbt_pointer_);
  ret = wally_psbt_combine(psbt_pointer, src_pointer);
  wally_psbt_free(src_pointer);  // free
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_psbt_combine NG[{}]", ret);
    throw CfdException(kCfdIllegalArgumentError, "psbt combine error.");
  }
  base_tx_ = RebuildTransaction(wally_psbt_pointer_);
}